

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thecl06.c
# Opt level: O1

thecl_t * th06_open(FILE *stream,uint version)

{
  value_t *pvVar1;
  ushort *puVar2;
  ushort uVar3;
  ushort uVar4;
  void *pvVar5;
  list_node_t *plVar6;
  double dVar7;
  undefined4 uVar8;
  uint uVar9;
  size_t length;
  void *map;
  thecl_t *ptVar10;
  undefined8 *data;
  char *pcVar11;
  thecl_instr_t *ptVar12;
  value_t *pvVar13;
  thecl_param_t *ptVar14;
  int *piVar15;
  char *pcVar16;
  value_t *pvVar17;
  uint uVar18;
  list_node_t *plVar19;
  long *plVar20;
  code *value_from_data;
  int iVar21;
  uint *puVar22;
  ulong uVar23;
  list_node_t *plVar24;
  ushort *puVar25;
  list_t *plVar26;
  int iVar27;
  uint *puVar28;
  list_node_t *list;
  byte bVar29;
  list_node_t *old;
  bool bVar30;
  char name [256];
  uint local_1bc;
  ulong local_198;
  ulong local_188;
  char local_138 [264];
  
  length = file_fsize(stream);
  if ((length == 0xffffffffffffffff) || (map = file_mmap(stream,length), map == (void *)0x0)) {
    ptVar10 = (thecl_t *)0x0;
  }
  else {
    puVar2 = (ushort *)((long)map + (ulong)(7 < version) * 4);
    if (version == 6) {
      local_198 = 1;
      local_188 = 3;
    }
    else if (version == 9) {
      local_198 = (ulong)puVar2[1];
      local_188 = local_198;
    }
    else {
      local_198 = (ulong)puVar2[1];
      local_188 = 0x10;
    }
    ptVar10 = thecl_new();
    ptVar10->version = version;
    uVar3 = *puVar2;
    ptVar10->sub_count = (ulong)uVar3;
    if ((ulong)uVar3 != 0) {
      uVar23 = 0;
      do {
        data = (undefined8 *)malloc(0x60);
        *data = 0;
        data[1] = 0;
        data[2] = 0;
        data[3] = 0;
        data[4] = 0;
        data[5] = 0;
        data[6] = 0;
        data[7] = 0;
        data[8] = 0;
        data[9] = 0;
        data[10] = 0;
        data[0xb] = 0;
        sprintf(local_138,"Sub%zu",uVar23);
        pcVar11 = strdup(local_138);
        *data = pcVar11;
        data[3] = 0;
        plVar26 = (list_t *)(data + 7);
        list_init(plVar26);
        list_init((list_t *)(data + 9));
        uVar18 = *(uint *)((long)map + (ulong)*(uint *)(puVar2 + (local_188 + uVar23) * 2 + 2));
        if (uVar18 != 0xffffffff) {
          puVar22 = (uint *)((ulong)*(uint *)(puVar2 + (local_188 + uVar23) * 2 + 2) + (long)map);
          local_1bc = 0;
          uVar3 = 0xff00;
          puVar28 = puVar22;
          do {
            if (*(short *)((long)puVar28 + 6) == 0) break;
            iVar27 = (int)puVar28;
            iVar21 = (int)puVar22;
            if (uVar18 != local_1bc) {
              ptVar12 = thecl_instr_time(uVar18);
              ptVar12->offset = iVar27 - iVar21;
              list_append_new(plVar26,ptVar12);
              local_1bc = *puVar28;
            }
            if (uVar3 != (ushort)puVar28[2]) {
              uVar9 = (uint)(ushort)((ushort)puVar28[2] >> 8);
              uVar18 = uVar9 | 0xf0;
              if ((version & 0xfffffffe) != 6) {
                uVar18 = uVar9;
              }
              ptVar12 = thecl_instr_rank(uVar18);
              ptVar12->offset = iVar27 - iVar21;
              list_append_new(plVar26,ptVar12);
              uVar3 = (ushort)puVar28[2];
            }
            ptVar12 = thecl_instr_new();
            uVar4 = (ushort)puVar28[1];
            ptVar12->id = (uint)uVar4;
            ptVar12->size = (uint)*(ushort *)((long)puVar28 + 6);
            ptVar12->offset = iVar27 - iVar21;
            ptVar12->address = (iVar27 - iVar21) + *(int *)(puVar2 + (local_188 + uVar23) * 2 + 2);
            pcVar11 = "";
            if (uVar4 != 0) {
              pcVar11 = th06_find_format(version,(uint)uVar4,false);
            }
            if (pcVar11 == (char *)0x0) {
              th06_open_cold_1();
            }
            else {
              if (0xc < (ulong)*(ushort *)((long)puVar28 + 6)) {
                value_from_data = th95_value_from_data;
                if ((version != 7) && (value_from_data = th95_value_from_data, version != 0x5f)) {
                  if (version == 8) {
                    value_from_data = th08_value_from_data;
                  }
                  else {
                    value_from_data = th06_value_from_data;
                  }
                }
                pvVar13 = value_list_from_data
                                    (value_from_data,(uchar *)(puVar28 + 3),
                                     (ulong)*(ushort *)((long)puVar28 + 6) - 0xc,pcVar11);
                if (pvVar13->type != 0) {
                  uVar18 = (uint)*(ushort *)((long)puVar28 + 10);
                  pvVar17 = pvVar13;
                  do {
                    ptVar14 = param_new((int)*pcVar11);
                    uVar8 = *(undefined4 *)&pvVar17->field_0x4;
                    dVar7 = (pvVar17->val).d;
                    (ptVar14->value).type = pvVar17->type;
                    *(undefined4 *)&(ptVar14->value).field_0x4 = uVar8;
                    (ptVar14->value).val.d = dVar7;
                    (ptVar14->value).val.m.data = (pvVar17->val).m.data;
                    if ((version != 6) && ((uVar18 & 1) != 0)) {
                      ptVar14->stack = 1;
                    }
                    uVar18 = uVar18 >> 1;
                    list_append_new(&ptVar12->params,ptVar14);
                    pcVar11 = pcVar11 + 1;
                    pvVar1 = pvVar17 + 1;
                    pvVar17 = pvVar17 + 1;
                  } while (pvVar1->type != 0);
                }
                free(pvVar13);
              }
              list_append_new(plVar26,ptVar12);
            }
            uVar18 = *(uint *)((long)puVar28 + (ulong)*(ushort *)((long)puVar28 + 6));
            puVar28 = (uint *)((long)puVar28 + (ulong)*(ushort *)((long)puVar28 + 6));
          } while (uVar18 != 0xffffffff);
        }
        list_append_new(&ptVar10->subs,data);
        uVar23 = uVar23 + 1;
      } while (uVar23 < *puVar2);
    }
    plVar19 = (list_node_t *)&ptVar10->subs;
    while (plVar19 = plVar19->next, plVar19 != (list_node_t *)0x0) {
      list = (list_node_t *)((long)plVar19->data + 0x38);
      plVar24 = list;
      while (plVar24 = plVar24->next, plVar24 != (list_node_t *)0x0) {
        pvVar5 = plVar24->data;
        plVar20 = (long *)((long)pvVar5 + 0x20);
LAB_00116fcc:
        plVar20 = (long *)*plVar20;
        if (plVar20 != (long *)0x0) {
          piVar15 = (int *)plVar20[2];
          if (*piVar15 == 0x6f) {
            if (piVar15[4] + *(int *)((long)pvVar5 + 0x40) == 0) {
              ptVar12 = thecl_instr_label(0);
              list_prepend_new((list_t *)list,ptVar12);
            }
            else if (list->next != (list_node_t *)0x0) {
              old = list->next;
              do {
                plVar6 = old->next;
                uVar18 = *(int *)((long)old->data + 0x34) + *(int *)((long)old->data + 0x40);
                if (uVar18 == piVar15[4] + *(int *)((long)pvVar5 + 0x40)) {
                  if (plVar6 == (list_node_t *)0x0) {
                    piVar15 = (int *)0x0;
                  }
                  else {
                    piVar15 = (int *)plVar6->data;
                  }
                  if ((piVar15 == (int *)0x0) || (*piVar15 != 3)) {
                    ptVar12 = thecl_instr_label(uVar18);
                    list_append_to((list_t *)list,ptVar12,old);
                  }
                  break;
                }
                old = plVar6;
              } while (plVar6 != (list_node_t *)0x0);
            }
          }
          goto LAB_00116fcc;
        }
      }
    }
    if (local_198 != 0) {
      uVar23 = 0;
LAB_00117097:
      uVar3 = 0;
      sprintf(local_138,"Timeline%zu",uVar23);
      pcVar11 = (char *)malloc(0x110);
      strcpy(pcVar11,local_138);
      plVar26 = (list_t *)(pcVar11 + 0x100);
      list_init(plVar26);
      puVar25 = (ushort *)((ulong)*(uint *)(puVar2 + uVar23 * 2 + 2) + (long)map);
      bVar29 = (version < 8) - 1;
      do {
        if (version < 8) {
          if (*puVar25 == 0xffff) {
            bVar30 = puVar25[1] == 4;
LAB_00117131:
            if (bVar30) goto LAB_0011727b;
          }
        }
        else if ((*puVar25 == 0xffff) && (puVar25[1] == 0xffff)) {
          bVar30 = (char)puVar25[3] == '\0';
          goto LAB_00117131;
        }
        if (*(byte *)((long)puVar25 + 7) != bVar29) {
          ptVar12 = thecl_instr_rank((uint)*(byte *)((long)puVar25 + 7));
          list_append_new(plVar26,ptVar12);
          bVar29 = *(byte *)((long)puVar25 + 7);
        }
        if (*puVar25 != uVar3) {
          ptVar12 = thecl_instr_time((uint)*puVar25);
          list_append_new(plVar26,ptVar12);
          uVar3 = *puVar25;
        }
        ptVar12 = thecl_instr_new();
        ptVar12->size = (uint)(byte)puVar25[3];
        uVar4 = puVar25[2];
        ptVar12->id = (uint)uVar4;
        pcVar16 = th06_find_timeline_format(version,(uint)uVar4);
        if (pcVar16 == (char *)0x0) {
          th06_open_cold_2();
        }
        else {
          ptVar14 = param_new((int)*pcVar16);
          (ptVar14->value).val.u = puVar25[1];
          list_append_new(&ptVar12->params,ptVar14);
          if (8 < (ulong)(byte)puVar25[3]) {
            pvVar17 = value_list_from_data
                                (::value_from_data,(uchar *)(puVar25 + 4),
                                 (ulong)(byte)puVar25[3] - 8,pcVar16 + 1);
            iVar21 = pvVar17->type;
            pvVar13 = pvVar17;
            while (iVar21 != 0) {
              ptVar14 = param_new(iVar21);
              uVar8 = *(undefined4 *)&pvVar13->field_0x4;
              dVar7 = (pvVar13->val).d;
              (ptVar14->value).type = pvVar13->type;
              *(undefined4 *)&(ptVar14->value).field_0x4 = uVar8;
              (ptVar14->value).val.d = dVar7;
              (ptVar14->value).val.m.data = (pvVar13->val).m.data;
              list_append_new(&ptVar12->params,ptVar14);
              iVar21 = pvVar13[1].type;
              pvVar13 = pvVar13 + 1;
            }
            free(pvVar17);
          }
          list_append_new(plVar26,ptVar12);
        }
        puVar25 = (ushort *)((long)puVar25 + (ulong)(byte)puVar25[3]);
      } while( true );
    }
LAB_001172a2:
    file_munmap(map,length);
  }
  return ptVar10;
LAB_0011727b:
  list_append_new(&ptVar10->timelines,pcVar11);
  uVar23 = uVar23 + 1;
  if (uVar23 == local_198) goto LAB_001172a2;
  goto LAB_00117097;
}

Assistant:

static thecl_t*
th06_open(
    FILE* stream,
    unsigned int version)
{
    long file_size;
    unsigned char* map;

    const th06_header_t* header;

    file_size = file_fsize(stream);
    if (file_size == -1)
        return NULL;

    map = file_mmap(stream, file_size);
    if (!map)
        return NULL;

    /* TODO: Check magic. */
    if (version >= 8)
        header = (th06_header_t*)(map + sizeof(uint32_t));
    else
        header = (th06_header_t*)map;

    size_t timeline_count;
    size_t timeline_count_max;
    if (version == 9) {
        timeline_count = header->timeline_count;
        timeline_count_max = header->timeline_count;
    } else if (version == 6) {
        timeline_count = 1;
        timeline_count_max = 3;
    } else {
        timeline_count = header->timeline_count;
        timeline_count_max = 16;
    }

    thecl_t* ecl = thecl_new();
    ecl->version = version;
    ecl->sub_count = header->sub_count;

    for (size_t s = 0; s < header->sub_count; ++s) {
        unsigned int rank = 0xff << 8;
        char name[256];
        thecl_sub_t* sub = malloc(sizeof(*sub));
        memset(sub, 0, sizeof(*sub));
        sprintf(name, "Sub%zu", s);
        sub->name = strdup(name);
        sub->format = NULL;
        list_init(&sub->instrs);
        list_init(&sub->labels);
        unsigned int time = 0;

        const void* raw_sub = map + header->offsets[timeline_count_max + s];
        const th06_instr_t* raw_instr = (th06_instr_t*)(raw_sub);
        while (raw_instr->time != 0xffffffff && raw_instr->size) {
            if (raw_instr->time != time) {
                thecl_instr_t* new = thecl_instr_time(raw_instr->time);
                new->offset = (ptrdiff_t)raw_instr - (ptrdiff_t)raw_sub;
                list_append_new(&sub->instrs, new);
                time = raw_instr->time;
            }

            if (raw_instr->rank_mask != rank) {
                uint16_t rank_mask = raw_instr->rank_mask >> 8;
                if (version == 6 || version == 7)
                    rank_mask |= 0xf0;
                thecl_instr_t* new = thecl_instr_rank(rank_mask & 0xff);
                new->offset = (ptrdiff_t)raw_instr - (ptrdiff_t)raw_sub;
                list_append_new(&sub->instrs, new);
                rank = raw_instr->rank_mask;
            }

            thecl_instr_t* instr = thecl_instr_new();
            instr->id = raw_instr->id;
            instr->size = raw_instr->size;
            instr->offset = (ptrdiff_t)raw_instr - (ptrdiff_t)raw_sub;
            instr->address = instr->offset + header->offsets[timeline_count_max + s];

            const char* format;

            if (raw_instr->id == 0)
                format = "";
            else
                format = th06_find_format(version, raw_instr->id, 0);

            if (!format) {
                fprintf(stderr, "%-3d %04xB R%04x [%04x]: ",
                    raw_instr->id,
                    raw_instr->size,
                    raw_instr->rank_mask,
                    raw_instr->param_mask
                );

                for (size_t d = 0; d < raw_instr->size - sizeof(th06_instr_t); d += 4) {
                    fprintf(stderr, " %08x (%d, %f)",
                        *(uint32_t*)(raw_instr->data + d),
                        *(int32_t*)(raw_instr->data + d),
                        *(float*)(raw_instr->data + d)
                        );
                }

                fprintf(stderr, "\n");
                goto next;
            }

            if (raw_instr->size > sizeof(th06_instr_t)) {
                value_t* values;
                if (version == 7 || version == 95)
                    values = value_list_from_data(th95_value_from_data, raw_instr->data, raw_instr->size - sizeof(th06_instr_t), format);
                else if (version == 8)
                    values = value_list_from_data(th08_value_from_data, raw_instr->data, raw_instr->size - sizeof(th06_instr_t), format);
                else
                    values = value_list_from_data(th06_value_from_data, raw_instr->data, raw_instr->size - sizeof(th06_instr_t), format);
                value_t* value_iter = values;
                uint16_t param_mask = raw_instr->param_mask;

                size_t p = 0;
                char f;
                while (value_iter->type) {
                    f = format[p];
                    thecl_param_t* param = param_new(f);
                    param->value = *value_iter;
                    if (version != 6 && param_mask & 1)
                        param->stack = 1;
                    param_mask >>= 1;
                    ++value_iter;
                    ++p;
                    list_append_new(&instr->params, param);
                }
                free(values);
            }

            list_append_new(&sub->instrs, instr);

next:
            raw_instr = (th06_instr_t*)((char*)raw_instr + raw_instr->size);
        }

        list_append_new(&ecl->subs, sub);
    }

    th06_insert_labels(ecl);

    thecl_timeline_t* timeline;

    for (size_t e = 0; e < timeline_count; ++e) {
        char name[128];
        sprintf(name, "Timeline%zu", e);

        timeline = malloc(sizeof(*timeline));
        strcpy(timeline->name, name);
        list_init(&timeline->instrs);

        uint16_t time = 0;
        uint8_t rank = version >= 8 ? 0xff : 0x00;
        th06_timeline_instr_t* raw_instr = (th06_timeline_instr_t*)(map + header->offsets[e]);
        while(!th06_check_timeline_sentinel(version, raw_instr)) {
            if (raw_instr->rank != rank) {
                thecl_instr_t* new = thecl_instr_rank(raw_instr->rank);
                list_append_new(&timeline->instrs, new);
                rank = raw_instr->rank;
            }
            if (raw_instr->time != time) {
                thecl_instr_t* new = thecl_instr_time(raw_instr->time);
                list_append_new(&timeline->instrs, new);
                time = raw_instr->time;
            }

            thecl_instr_t* instr = thecl_instr_new();
            instr->size = raw_instr->size;
            instr->id = raw_instr->id;

            const char* format = th06_find_timeline_format(version, raw_instr->id);

            if (!format) {
                fprintf(stderr, "%-3d %04xB: ",
                    raw_instr->id,
                    raw_instr->size
                    );

                for (size_t d = 0; d < raw_instr->size - sizeof(th06_timeline_instr_t); d += 4) {
                    fprintf(stderr, " %08x (%d, %f)",
                        *(uint32_t*)(raw_instr->data + d),
                        *(int32_t*)(raw_instr->data + d),
                        *(float*)(raw_instr->data + d)
                        );
                }

                fprintf(stderr, "\n");
            } else {
                thecl_param_t* param0 = param_new(format[0]);
                param0->value.val.s = raw_instr->arg0;
                list_append_new(&instr->params, param0);

                if (raw_instr->size > sizeof(th06_timeline_instr_t)) {
                    /* The first parameter is in the struct and is always s, so it needs to be ignored here. */
                    value_t* values = value_list_from_data(value_from_data, raw_instr->data, raw_instr->size - sizeof(th06_timeline_instr_t), format + 1);
                    value_t* value_iter = values;
                    while (value_iter->type) {
                        thecl_param_t* param = param_new(value_iter->type);
                        param->value = *value_iter;
                        ++value_iter;
                        list_append_new(&instr->params, param);
                    }
                    free(values);
                }

                list_append_new(&timeline->instrs, instr);
            }

            raw_instr = (th06_timeline_instr_t*)((char*)raw_instr + raw_instr->size);
        }

        list_append_new(&ecl->timelines, timeline);
    }

    file_munmap(map, file_size);

    return ecl;
}